

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O0

void __thiscall LinkedReadsDatastore::LinkedReadsDatastore(LinkedReadsDatastore *this,WorkSpace *ws)

{
  undefined8 in_RSI;
  string *in_RDI;
  LinkedReadsDatastore *in_stack_00000010;
  WorkSpace *in_stack_00000018;
  LinkedReadsMapper *in_stack_00000020;
  
  std::__cxx11::string::string(in_RDI);
  LinkedReadsMapper::LinkedReadsMapper(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  std::__cxx11::string::string(in_RDI + 0xd0);
  std::__cxx11::string::string(in_RDI + 0xf0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x3c4030);
  *(undefined8 *)(in_RDI + 0x128) = 0;
  *(undefined8 *)(in_RDI + 0x130) = in_RSI;
  return;
}

Assistant:

LinkedReadsDatastore::LinkedReadsDatastore(WorkSpace &ws) : ws(ws), mapper(ws, *this) {
}